

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

Error asmjit::v1_14::Formatter::formatNode
                (String *sb,FormatOptions *formatOptions,BaseBuilder *builder,BaseNode *node)

{
  long lVar1;
  bool bVar2;
  Error EVar3;
  String *this;
  Section **ppSVar4;
  size_t sVar5;
  ulong uVar6;
  long in_RCX;
  String *sb_00;
  long in_RDX;
  FormatFlags *in_RSI;
  BaseCompiler *in_RDI;
  Error _err_31;
  Error _err_30;
  Error _err_29;
  size_t currentPadding;
  size_t requiredPadding;
  Error _err_28;
  Error _err_27;
  InvokeNode *invokeNode;
  Error _err_26;
  Error _err_25;
  Operand_ *op;
  uint32_t i;
  Error _err_24;
  FuncRetNode *retNode;
  Error _err_23;
  Error _err_22;
  Error _err_21;
  Error _err_20;
  Error _err_19;
  Error _err_18;
  FuncNode *funcNode;
  Error _err_17;
  char *sentinelName;
  SentinelNode *sentinelNode;
  CommentNode *commentNode;
  Error _err_16;
  ConstPoolNode *constPoolNode;
  Error _err_15;
  Error _err_14;
  Error _err_13;
  Error _err_12;
  Error _err_11;
  EmbedLabelDeltaNode *embedNode_2;
  Error _err_10;
  Error _err_9;
  EmbedLabelNode *embedNode_1;
  Error _err_8;
  Error _err_7;
  Error _err_6;
  EmbedDataNode *embedNode;
  Error _err_5;
  AlignNode *alignNode;
  Error _err_4;
  Error _err_3;
  LabelNode *labelNode;
  Error _err_2;
  Section *section;
  SectionNode *sectionNode;
  Error _err_1;
  InstNode *instNode;
  size_t startLineIndex;
  Error _err;
  BaseCompiler *in_stack_fffffffffffff928;
  Operand_ *in_stack_fffffffffffff930;
  FormatFlags formatFlags;
  ZoneVector<asmjit::v1_14::Section_*> *in_stack_fffffffffffff938;
  char *in_stack_fffffffffffff940;
  BaseCompiler *in_stack_fffffffffffff948;
  ModifyOp op_00;
  BaseCompiler *cc;
  FormatFlags in_stack_fffffffffffff96c;
  undefined4 in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff974;
  byte local_671;
  undefined4 local_670;
  undefined4 local_66c;
  long local_668;
  undefined4 local_660;
  uint32_t in_stack_fffffffffffff9a4;
  BaseEmitter *in_stack_fffffffffffff9a8;
  uint local_650;
  FormatFlags in_stack_fffffffffffff9b4;
  String *in_stack_fffffffffffff9b8;
  char *local_618;
  undefined1 local_608 [4];
  undefined8 local_5f8;
  undefined8 local_5f0;
  undefined4 local_5e4;
  long local_5e0;
  undefined4 local_5d4;
  Error local_5d0;
  Error local_5cc;
  Error local_5c8;
  Error local_5c4;
  long local_5c0;
  undefined4 local_5b8;
  Error local_5b4;
  long local_5b0;
  long local_5a8;
  undefined8 local_5a0;
  undefined8 local_598;
  undefined4 local_58c;
  Error local_588;
  Error local_584;
  long local_580;
  uint local_578;
  undefined4 local_574;
  long local_570;
  undefined4 local_568;
  Error local_564;
  long local_560;
  FixedString<36UL> *local_558;
  undefined4 local_54c;
  Section *local_548;
  long local_540;
  undefined4 local_534;
  long local_530;
  String *local_528;
  uint local_520;
  undefined4 local_51c;
  long local_518;
  long local_510;
  FormatFlags *local_508;
  BaseCompiler *local_500;
  undefined8 local_4f0;
  undefined8 local_4e8;
  BaseCompiler *local_4e0;
  undefined8 local_4d8;
  char *local_4d0;
  BaseCompiler *local_4c8;
  undefined8 local_4c0;
  char *local_4b8;
  BaseCompiler *local_4b0;
  undefined8 local_4a8;
  char *local_4a0;
  BaseCompiler *local_498;
  undefined8 local_490;
  char *local_488;
  BaseCompiler *local_480;
  undefined8 local_478;
  char *local_470;
  BaseCompiler *local_468;
  undefined8 local_460;
  char *local_458;
  BaseCompiler *local_450;
  undefined8 local_448;
  char *local_440;
  BaseCompiler *local_438;
  undefined8 local_430;
  char *local_428;
  BaseCompiler *local_420;
  undefined8 local_418;
  char *local_410;
  BaseCompiler *local_408;
  undefined8 local_400;
  char *local_3f8;
  BaseCompiler *local_3f0;
  undefined8 local_3e8;
  char *local_3e0;
  BaseCompiler *local_3d8;
  undefined8 local_3d0;
  char *local_3c8;
  BaseCompiler *local_3c0;
  undefined1 local_3b1;
  BaseCompiler *local_3b0;
  undefined4 local_39c;
  uint *local_390;
  char *local_388;
  BaseCompiler *local_380;
  long local_378;
  BaseCompiler *local_370;
  BaseCompiler *local_368;
  long local_360;
  long local_358;
  long local_350;
  FormatFlags *local_348;
  FormatFlags *local_340;
  FormatFlags *local_338;
  FormatFlags *local_330;
  FormatFlags *local_328;
  FormatFlags *local_320;
  FormatFlags *local_318;
  FormatFlags *local_310;
  FormatFlags *local_308;
  FormatFlags *local_300;
  FormatFlags *local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  uint local_294;
  long local_290;
  long local_288;
  long local_280;
  undefined4 local_274;
  undefined8 local_270;
  undefined1 *local_268;
  char *local_260;
  BaseCompiler *local_258;
  FixedString<36UL> **local_250;
  char *local_248;
  BaseCompiler *local_240;
  Section *local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  BaseEmitter *local_210;
  uint *local_208;
  char *local_200;
  BaseCompiler *local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  char *local_1b8;
  BaseCompiler *local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  undefined8 *local_160;
  undefined8 *local_158;
  char *local_150;
  BaseCompiler *local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  undefined4 local_d4;
  Operand *local_d0;
  long local_c8;
  byte *local_c0;
  char *local_b8;
  BaseCompiler *local_b0;
  long local_a8;
  long local_a0;
  undefined1 local_91;
  BaseCompiler *local_90;
  long local_88;
  BaseCompiler *local_80;
  BaseCompiler *local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  undefined1 *local_50;
  long local_48;
  long local_40;
  undefined1 *local_38;
  long local_30;
  long local_28;
  long local_20;
  undefined4 *local_18;
  Operand *local_10;
  undefined4 local_8;
  undefined4 local_4;
  
  local_518 = in_RCX;
  local_510 = in_RDX;
  local_508 = in_RSI;
  local_500 = in_RDI;
  if (*(int *)(in_RCX + 0x14) != 0) {
    local_39c = 0x20;
    bVar2 = Support::test<asmjit::v1_14::FormatFlags,asmjit::v1_14::FormatFlags>(*in_RSI,kPositions)
    ;
    if (bVar2) {
      local_378 = local_518;
      local_520 = *(uint *)(local_518 + 0x14);
      local_380 = local_500;
      local_388 = "<%05u> ";
      local_390 = &local_520;
      EVar3 = String::_opFormat((String *)local_500,kAppend,"<%05u> ",(ulong)local_520);
      if (EVar3 != 0) {
        return EVar3;
      }
      local_51c = 0;
    }
  }
  lVar1 = local_518;
  local_368 = local_500;
  local_80 = local_500;
  if (*(byte *)&(local_500->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter < 0x1f) {
    this = (String *)
           (ulong)*(byte *)&(local_500->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter;
  }
  else {
    this = *(String **)&(local_500->super_BaseBuilder).super_BaseEmitter._emitterType;
  }
  local_358 = local_518;
  sb_00 = (String *)(ulong)(byte)(*(char *)(local_518 + 0x10) - 1);
  local_528 = this;
  switch(sb_00) {
  case (String *)0x0:
  case (String *)0xe:
    local_350 = local_518;
    local_530 = local_518;
    local_2f8 = local_508;
    local_2d8 = local_510;
    local_70 = local_510;
    local_50 = (undefined1 *)(local_510 + 0x48);
    local_2c8 = local_518;
    local_2b8 = local_518;
    local_2a8 = local_518;
    EVar3 = (**(code **)(local_510 + 0x80))
                      (local_500,*local_508,local_510,*local_50,local_518 + 0x30,local_518 + 0x40,
                       *(undefined1 *)(local_518 + 0x12));
    if (EVar3 != 0) {
      return EVar3;
    }
    local_534 = 0;
    break;
  case (String *)0x1:
    local_2a0 = local_518;
    local_540 = local_518;
    local_290 = *(long *)(local_510 + 0x30);
    local_280 = local_518;
    local_294 = *(uint *)(local_518 + 0x30);
    local_88 = local_290 + 0xd8;
    if (local_294 < *(uint *)(local_290 + 0xe0)) {
      local_270 = *(undefined8 *)(local_510 + 0x30);
      local_288 = local_518;
      local_274 = *(undefined4 *)(local_518 + 0x30);
      ppSVar4 = ZoneVector<asmjit::v1_14::Section_*>::operator[]
                          (in_stack_fffffffffffff938,(size_t)in_stack_fffffffffffff930);
      local_548 = *ppSVar4;
      local_558 = &local_548->_name;
      local_240 = local_500;
      local_248 = ".section %s";
      local_250 = &local_558;
      local_238 = local_548;
      EVar3 = String::_opFormat((String *)local_500,kAppend,".section %s",local_558);
      if (EVar3 != 0) {
        return EVar3;
      }
      local_54c = 0;
    }
    break;
  case (String *)0x2:
    local_230 = local_518;
    local_560 = local_518;
    local_300 = local_508;
    local_220 = local_518;
    local_564 = formatLabel(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b4,
                            in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a4);
    if (local_564 != 0) {
      return local_564;
    }
    local_3c0 = local_500;
    local_3c8 = ":";
    local_3d0 = 0xffffffffffffffff;
    EVar3 = String::_opString(this,(ModifyOp)((ulong)sb_00 >> 0x20),
                              (char *)in_stack_fffffffffffff948,(size_t)in_stack_fffffffffffff940);
    if (EVar3 != 0) {
      return EVar3;
    }
    local_568 = 0;
    break;
  case (String *)0x3:
    local_218 = local_518;
    local_570 = local_518;
    local_1f0 = local_518;
    local_578 = *(uint *)(local_518 + 0x30);
    local_1e8 = local_518;
    if (*(char *)(local_518 + 0x12) == '\0') {
      in_stack_fffffffffffff940 = "code";
    }
    else {
      in_stack_fffffffffffff940 = "data";
    }
    local_1f8 = local_500;
    local_200 = ".align %u (%s)";
    local_208 = &local_578;
    in_stack_fffffffffffff948 = local_500;
    local_210 = (BaseEmitter *)in_stack_fffffffffffff940;
    EVar3 = String::_opFormat((String *)local_500,kAppend,".align %u (%s)",(ulong)local_578,
                              in_stack_fffffffffffff940);
    if (EVar3 != 0) {
      return EVar3;
    }
    local_574 = 0;
    break;
  case (String *)0x4:
    local_1e0 = local_518;
    local_580 = local_518;
    local_3b0 = local_500;
    local_3b1 = 0x2e;
    local_584 = String::_opChar((String *)in_stack_fffffffffffff938,
                                (ModifyOp)((ulong)in_stack_fffffffffffff930 >> 0x20),
                                (char)((ulong)in_stack_fffffffffffff930 >> 0x18));
    if (local_584 != 0) {
      return local_584;
    }
    local_308 = local_508;
    local_2e0 = local_510;
    local_68 = local_510;
    local_48 = local_510 + 0x48;
    local_1d8 = local_580;
    local_588 = formatDataType((String *)in_stack_fffffffffffff938,
                               (FormatFlags)((ulong)in_stack_fffffffffffff930 >> 0x20),
                               (Arch)((ulong)in_stack_fffffffffffff930 >> 0x18),
                               (TypeId)((ulong)in_stack_fffffffffffff930 >> 0x10));
    if (local_588 != 0) {
      return local_588;
    }
    local_1a8 = local_580;
    local_598 = *(undefined8 *)(local_580 + 0x30);
    local_1a0 = local_580;
    local_5a0 = *(undefined8 *)(local_580 + 0x38);
    local_198 = local_580;
    local_30 = local_580;
    local_5a8 = (ulong)*(byte *)(local_580 + 0x13) * *(long *)(local_580 + 0x30);
    local_1b0 = local_500;
    local_1b8 = " {Count=%zu Repeat=%zu TotalSize=%zu}";
    local_1c0 = &local_598;
    local_1c8 = &local_5a0;
    local_1d0 = &local_5a8;
    EVar3 = String::_opFormat((String *)local_500,kAppend," {Count=%zu Repeat=%zu TotalSize=%zu}",
                              local_598,local_5a0,local_5a8);
    if (EVar3 != 0) {
      return EVar3;
    }
    local_58c = 0;
    break;
  case (String *)0x5:
    local_190 = local_518;
    local_5b0 = local_518;
    local_3d8 = local_500;
    local_3e0 = ".label ";
    local_3e8 = 0xffffffffffffffff;
    local_5b4 = String::_opString(this,kAssign,(char *)in_stack_fffffffffffff948,
                                  (size_t)in_stack_fffffffffffff940);
    if (local_5b4 != 0) {
      return local_5b4;
    }
    local_310 = local_508;
    local_188 = local_5b0;
    EVar3 = formatLabel(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b4,
                        in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a4);
    if (EVar3 != 0) {
      return EVar3;
    }
    local_5b8 = 0;
    break;
  case (String *)0x6:
    local_180 = local_518;
    local_5c0 = local_518;
    local_3f0 = local_500;
    local_3f8 = ".label (";
    local_400 = 0xffffffffffffffff;
    local_5c4 = String::_opString(this,kAssign,(char *)in_stack_fffffffffffff948,
                                  (size_t)in_stack_fffffffffffff940);
    if (local_5c4 != 0) {
      return local_5c4;
    }
    local_318 = local_508;
    local_178 = local_5c0;
    local_5c8 = formatLabel(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b4,
                            in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a4);
    if (local_5c8 != 0) {
      return local_5c8;
    }
    local_408 = local_500;
    local_410 = " - ";
    local_418 = 0xffffffffffffffff;
    local_5cc = String::_opString(this,(ModifyOp)((ulong)sb_00 >> 0x20),
                                  (char *)in_stack_fffffffffffff948,
                                  (size_t)in_stack_fffffffffffff940);
    if (local_5cc != 0) {
      return local_5cc;
    }
    local_320 = local_508;
    local_170 = local_5c0;
    local_5d0 = formatLabel(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b4,
                            in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a4);
    if (local_5d0 != 0) {
      return local_5d0;
    }
    local_420 = local_500;
    local_428 = ")";
    local_430 = 0xffffffffffffffff;
    EVar3 = String::_opString(this,(ModifyOp)((ulong)sb_00 >> 0x20),
                              (char *)in_stack_fffffffffffff948,(size_t)in_stack_fffffffffffff940);
    if (EVar3 != 0) {
      return EVar3;
    }
    local_5d4 = 0;
    break;
  case (String *)0x7:
    local_168 = local_518;
    local_5e0 = local_518;
    local_140 = local_518;
    local_28 = local_518 + 0x38;
    local_5f0 = *(undefined8 *)(local_518 + 0x128);
    local_138 = local_518;
    local_20 = local_518 + 0x38;
    local_5f8 = *(undefined8 *)(local_518 + 0x130);
    local_148 = local_500;
    local_150 = "[ConstPool Size=%zu Alignment=%zu]";
    local_158 = &local_5f0;
    local_160 = &local_5f8;
    EVar3 = String::_opFormat((String *)local_500,kAppend,"[ConstPool Size=%zu Alignment=%zu]",
                              local_5f0,local_5f8);
    if (EVar3 != 0) {
      return EVar3;
    }
    local_5e4 = 0;
    break;
  case (String *)0x8:
    local_130 = local_518;
    local_120 = local_518;
    _local_608 = *(undefined8 *)(local_518 + 0x28);
    local_258 = local_500;
    local_260 = "; %s";
    local_268 = local_608;
    EVar3 = String::_opFormat((String *)local_500,kAppend,"; %s",_local_608);
    return EVar3;
  case (String *)0x9:
    local_118 = local_518;
    local_110 = local_518;
    if (*(char *)(local_518 + 0x12) == '\x01') {
      local_618 = "[FuncEnd]";
    }
    else {
      local_618 = "[Sentinel]";
    }
    local_438 = local_500;
    local_440 = local_618;
    local_448 = 0xffffffffffffffff;
    EVar3 = String::_opString(this,kAssign,(char *)in_stack_fffffffffffff948,
                              (size_t)in_stack_fffffffffffff940);
    goto joined_r0x0013c60c;
  default:
    local_360 = local_518;
    local_671 = *(byte *)(local_518 + 0x10);
    local_b0 = local_500;
    local_b8 = "[UserNode:%u]";
    local_c0 = &local_671;
    EVar3 = String::_opFormat((String *)local_500,kAppend,"[UserNode:%u]",(ulong)local_671);
    if (EVar3 != 0) {
      return EVar3;
    }
    local_670 = 0;
    break;
  case (String *)0xf:
    local_108 = local_518;
    local_100 = local_510;
    if (*(char *)(local_510 + 8) != '\x03') break;
    local_328 = local_508;
    local_228 = local_518;
    cc = local_500;
    EVar3 = formatLabel(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b4,
                        in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a4);
    formatFlags = (FormatFlags)((ulong)in_stack_fffffffffffff930 >> 0x20);
    if (EVar3 != 0) {
      return EVar3;
    }
    local_450 = local_500;
    local_458 = ": ";
    local_460 = 0xffffffffffffffff;
    EVar3 = String::_opString(this,(ModifyOp)((ulong)sb_00 >> 0x20),
                              (char *)in_stack_fffffffffffff948,(size_t)in_stack_fffffffffffff940);
    if (EVar3 != 0) {
      return EVar3;
    }
    local_330 = local_508;
    local_f0 = lVar1;
    EVar3 = formatFuncRets((String *)in_stack_fffffffffffff938,formatFlags,in_stack_fffffffffffff928
                           ,(FuncDetail *)0x13c451);
    if (EVar3 != 0) {
      return EVar3;
    }
    local_468 = local_500;
    local_470 = " Func(";
    local_478 = 0xffffffffffffffff;
    EVar3 = String::_opString(this,(ModifyOp)((ulong)sb_00 >> 0x20),
                              (char *)in_stack_fffffffffffff948,(size_t)in_stack_fffffffffffff940);
    if (EVar3 != 0) {
      return EVar3;
    }
    local_338 = local_508;
    local_f8 = lVar1;
    local_e8 = lVar1;
    EVar3 = formatFuncArgs((String *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                           in_stack_fffffffffffff96c,cc,(FuncDetail *)this,(ArgPack *)sb_00);
    if (EVar3 != 0) {
      return EVar3;
    }
    local_480 = local_500;
    local_488 = ")";
    local_490 = 0xffffffffffffffff;
    EVar3 = String::_opString(this,(ModifyOp)((ulong)sb_00 >> 0x20),
                              (char *)in_stack_fffffffffffff948,(size_t)in_stack_fffffffffffff940);
joined_r0x0013c60c:
    if (EVar3 != 0) {
      return EVar3;
    }
    break;
  case (String *)0x10:
    local_e0 = local_518;
    local_498 = local_500;
    local_4a0 = "[FuncRet]";
    local_4a8 = 0xffffffffffffffff;
    EVar3 = String::_opString(this,kAssign,(char *)in_stack_fffffffffffff948,
                              (size_t)in_stack_fffffffffffff940);
    if (EVar3 != 0) {
      return EVar3;
    }
    for (local_650 = 0; local_650 < 2; local_650 = local_650 + 1) {
      local_d0 = InstNode::op((InstNode *)in_stack_fffffffffffff938,
                              (uint32_t)((ulong)in_stack_fffffffffffff930 >> 0x20));
      local_8 = 0;
      local_4 = 0;
      local_d4 = 0;
      local_18 = &local_d4;
      local_10 = local_d0;
      if ((local_d0->super_Operand_)._signature._bits != 0) {
        local_4b8 = ", ";
        if (local_650 == 0) {
          local_4b8 = " ";
        }
        local_4b0 = local_500;
        local_4c0 = 0xffffffffffffffff;
        EVar3 = String::_opString(this,(ModifyOp)((ulong)sb_00 >> 0x20),
                                  (char *)in_stack_fffffffffffff948,
                                  (size_t)in_stack_fffffffffffff940);
        if (EVar3 != 0) {
          return EVar3;
        }
        local_340 = local_508;
        local_2e8 = local_510;
        local_60 = local_510;
        local_40 = local_510 + 0x48;
        EVar3 = formatOperand(sb_00,(FormatFlags)((ulong)in_stack_fffffffffffff948 >> 0x20),
                              (BaseEmitter *)in_stack_fffffffffffff940,
                              (Arch)((ulong)in_stack_fffffffffffff938 >> 0x38),
                              in_stack_fffffffffffff930);
        if (EVar3 != 0) {
          return EVar3;
        }
        local_660 = 0;
      }
    }
    break;
  case (String *)0x11:
    local_c8 = local_518;
    local_668 = local_518;
    local_348 = local_508;
    local_2f0 = local_510;
    local_58 = local_510;
    local_38 = (undefined1 *)(local_510 + 0x48);
    local_2d0 = local_518;
    local_2c0 = local_518;
    local_2b0 = local_518;
    EVar3 = (**(code **)(local_510 + 0x80))
                      (local_500,*local_508,local_510,*local_38,local_518 + 0x30,local_518 + 0x40,
                       *(undefined1 *)(local_518 + 0x12));
    if (EVar3 != 0) {
      return EVar3;
    }
    local_66c = 0;
  }
  op_00 = (ModifyOp)((ulong)sb_00 >> 0x20);
  local_a8 = local_518;
  if (*(long *)(local_518 + 0x28) != 0) {
    sVar5 = paddingFromOptions((FormatOptions *)in_stack_fffffffffffff940,
                               (FormatPaddingGroup)((ulong)in_stack_fffffffffffff938 >> 0x20));
    local_370 = local_500;
    local_78 = local_500;
    if (*(byte *)&(local_500->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter < 0x1f) {
      uVar6 = (ulong)*(byte *)&(local_500->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter;
    }
    else {
      uVar6._0_1_ = (local_500->super_BaseBuilder).super_BaseEmitter._emitterType;
      uVar6._1_1_ = (local_500->super_BaseBuilder).super_BaseEmitter._emitterFlags;
      uVar6._2_1_ = (local_500->super_BaseBuilder).super_BaseEmitter._instructionAlignment;
      uVar6._3_1_ = (local_500->super_BaseBuilder).super_BaseEmitter._reservedBaseEmitter;
      uVar6._4_4_ = (local_500->super_BaseBuilder).super_BaseEmitter._validationFlags;
    }
    if (uVar6 - (long)local_528 < sVar5) {
      local_a0 = sVar5 - (uVar6 - (long)local_528);
      local_90 = local_500;
      local_91 = 0x20;
      EVar3 = String::_opChars((String *)in_stack_fffffffffffff948,
                               (ModifyOp)((ulong)in_stack_fffffffffffff940 >> 0x20),
                               (char)((ulong)in_stack_fffffffffffff940 >> 0x18),(size_t)local_500);
      if (EVar3 != 0) {
        return EVar3;
      }
    }
    local_4c8 = local_500;
    local_4d0 = "; ";
    local_4d8 = 0xffffffffffffffff;
    EVar3 = String::_opString(this,op_00,(char *)in_stack_fffffffffffff948,
                              (size_t)in_stack_fffffffffffff940);
    if (EVar3 != 0) {
      return EVar3;
    }
    local_128 = local_518;
    local_4e8 = *(undefined8 *)(local_518 + 0x28);
    local_4e0 = local_500;
    local_4f0 = 0xffffffffffffffff;
    EVar3 = String::_opString(this,op_00,(char *)in_stack_fffffffffffff948,
                              (size_t)in_stack_fffffffffffff940);
    if (EVar3 != 0) {
      return EVar3;
    }
  }
  return 0;
}

Assistant:

Error formatNode(
  String& sb,
  const FormatOptions& formatOptions,
  const BaseBuilder* builder,
  const BaseNode* node) noexcept {

  if (node->hasPosition() && formatOptions.hasFlag(FormatFlags::kPositions))
    ASMJIT_PROPAGATE(sb.appendFormat("<%05u> ", node->position()));

  size_t startLineIndex = sb.size();

  switch (node->type()) {
    case NodeType::kInst:
    case NodeType::kJump: {
      const InstNode* instNode = node->as<InstNode>();
      ASMJIT_PROPAGATE(builder->_funcs.formatInstruction(sb, formatOptions.flags(), builder,
        builder->arch(),
        instNode->baseInst(), instNode->operands(), instNode->opCount()));
      break;
    }

    case NodeType::kSection: {
      const SectionNode* sectionNode = node->as<SectionNode>();
      if (builder->_code->isSectionValid(sectionNode->id())) {
        const Section* section = builder->_code->sectionById(sectionNode->id());
        ASMJIT_PROPAGATE(sb.appendFormat(".section %s", section->name()));
      }
      break;
    }

    case NodeType::kLabel: {
      const LabelNode* labelNode = node->as<LabelNode>();
      ASMJIT_PROPAGATE(formatLabel(sb, formatOptions.flags(), builder, labelNode->labelId()));
      ASMJIT_PROPAGATE(sb.append(":"));
      break;
    }

    case NodeType::kAlign: {
      const AlignNode* alignNode = node->as<AlignNode>();
      ASMJIT_PROPAGATE(sb.appendFormat(".align %u (%s)",
        alignNode->alignment(),
        alignNode->alignMode() == AlignMode::kCode ? "code" : "data"));
      break;
    }

    case NodeType::kEmbedData: {
      const EmbedDataNode* embedNode = node->as<EmbedDataNode>();
      ASMJIT_PROPAGATE(sb.append('.'));
      ASMJIT_PROPAGATE(formatDataType(sb, formatOptions.flags(), builder->arch(), embedNode->typeId()));
      ASMJIT_PROPAGATE(sb.appendFormat(" {Count=%zu Repeat=%zu TotalSize=%zu}", embedNode->itemCount(), embedNode->repeatCount(), embedNode->dataSize()));
      break;
    }

    case NodeType::kEmbedLabel: {
      const EmbedLabelNode* embedNode = node->as<EmbedLabelNode>();
      ASMJIT_PROPAGATE(sb.append(".label "));
      ASMJIT_PROPAGATE(formatLabel(sb, formatOptions.flags(), builder, embedNode->labelId()));
      break;
    }

    case NodeType::kEmbedLabelDelta: {
      const EmbedLabelDeltaNode* embedNode = node->as<EmbedLabelDeltaNode>();
      ASMJIT_PROPAGATE(sb.append(".label ("));
      ASMJIT_PROPAGATE(formatLabel(sb, formatOptions.flags(), builder, embedNode->labelId()));
      ASMJIT_PROPAGATE(sb.append(" - "));
      ASMJIT_PROPAGATE(formatLabel(sb, formatOptions.flags(), builder, embedNode->baseLabelId()));
      ASMJIT_PROPAGATE(sb.append(")"));
      break;
    }

    case NodeType::kConstPool: {
      const ConstPoolNode* constPoolNode = node->as<ConstPoolNode>();
      ASMJIT_PROPAGATE(sb.appendFormat("[ConstPool Size=%zu Alignment=%zu]", constPoolNode->size(), constPoolNode->alignment()));
      break;
    };

    case NodeType::kComment: {
      const CommentNode* commentNode = node->as<CommentNode>();
      return sb.appendFormat("; %s", commentNode->inlineComment());
    }

    case NodeType::kSentinel: {
      const SentinelNode* sentinelNode = node->as<SentinelNode>();
      const char* sentinelName = nullptr;

      switch (sentinelNode->sentinelType()) {
        case SentinelType::kFuncEnd:
          sentinelName = "[FuncEnd]";
          break;

        default:
          sentinelName = "[Sentinel]";
          break;
      }

      ASMJIT_PROPAGATE(sb.append(sentinelName));
      break;
    }

#ifndef ASMJIT_NO_COMPILER
    case NodeType::kFunc: {
      const FuncNode* funcNode = node->as<FuncNode>();

      if (builder->isCompiler()) {
        ASMJIT_PROPAGATE(formatLabel(sb, formatOptions.flags(), builder, funcNode->labelId()));
        ASMJIT_PROPAGATE(sb.append(": "));

        ASMJIT_PROPAGATE(formatFuncRets(sb, formatOptions.flags(), static_cast<const BaseCompiler*>(builder), funcNode->detail()));
        ASMJIT_PROPAGATE(sb.append(" Func("));
        ASMJIT_PROPAGATE(formatFuncArgs(sb, formatOptions.flags(), static_cast<const BaseCompiler*>(builder), funcNode->detail(), funcNode->argPacks()));
        ASMJIT_PROPAGATE(sb.append(")"));
      }
      break;
    }

    case NodeType::kFuncRet: {
      const FuncRetNode* retNode = node->as<FuncRetNode>();
      ASMJIT_PROPAGATE(sb.append("[FuncRet]"));

      for (uint32_t i = 0; i < 2; i++) {
        const Operand_& op = retNode->op(i);
        if (!op.isNone()) {
          ASMJIT_PROPAGATE(sb.append(i == 0 ? " " : ", "));
          ASMJIT_PROPAGATE(formatOperand(sb, formatOptions.flags(), builder, builder->arch(), op));
        }
      }
      break;
    }

    case NodeType::kInvoke: {
      const InvokeNode* invokeNode = node->as<InvokeNode>();
      ASMJIT_PROPAGATE(builder->_funcs.formatInstruction(sb, formatOptions.flags(), builder,
        builder->arch(),
        invokeNode->baseInst(), invokeNode->operands(), invokeNode->opCount()));
      break;
    }
#endif

    default: {
      ASMJIT_PROPAGATE(sb.appendFormat("[UserNode:%u]", node->type()));
      break;
    }
  }

  if (node->hasInlineComment()) {
    size_t requiredPadding = paddingFromOptions(formatOptions, FormatPaddingGroup::kRegularLine);
    size_t currentPadding = sb.size() - startLineIndex;

    if (currentPadding < requiredPadding)
      ASMJIT_PROPAGATE(sb.appendChars(' ', requiredPadding - currentPadding));

    ASMJIT_PROPAGATE(sb.append("; "));
    ASMJIT_PROPAGATE(sb.append(node->inlineComment()));
  }

  return kErrorOk;
}